

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDFace::RemoveEdgeFromArray(ON_SubDFace *this,uint i,ON_SubDEdgePtr *removed_edge)

{
  uint uVar1;
  ON_SubDEdgePtr *local_48;
  ON_SubDEdgePtr *edge_j;
  uint j;
  uint count;
  ON_SubDEdgePtr *removed_edge_local;
  uint i_local;
  ON_SubDFace *this_local;
  
  removed_edge->m_ptr = (ON__UINT_PTR)(ON_SubDEdgePtr)0x0;
  uVar1 = (uint)this->m_edge_count;
  if (i < uVar1) {
    if (i < 4) {
      removed_edge->m_ptr = this->m_edge4[i].m_ptr;
    }
    if (4 < uVar1) {
      if ((this->m_edgex == (ON_SubDEdgePtr *)0x0) ||
         (this->m_edgex_capacity + 4 < (uint)this->m_edge_count)) {
        ON_SubDIncrementErrorCount();
        return false;
      }
      if (3 < i) {
        removed_edge->m_ptr = this->m_edgex[i - 4].m_ptr;
      }
    }
    removed_edge_local._4_4_ = i;
    for (edge_j._0_4_ = i + 1; (uint)edge_j < uVar1; edge_j._0_4_ = (uint)edge_j + 1) {
      if ((uint)edge_j < 4) {
        local_48 = this->m_edge4 + (uint)edge_j;
      }
      else {
        local_48 = this->m_edgex + ((uint)edge_j - 4);
      }
      if (removed_edge_local._4_4_ < 4) {
        this->m_edge4[removed_edge_local._4_4_].m_ptr = local_48->m_ptr;
      }
      else {
        this->m_edgex[removed_edge_local._4_4_ - 4].m_ptr = local_48->m_ptr;
      }
      removed_edge_local._4_4_ = removed_edge_local._4_4_ + 1;
    }
    this->m_edge_count = this->m_edge_count - 1;
    this_local._7_1_ = true;
  }
  else {
    ON_SubDIncrementErrorCount();
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDFace::RemoveEdgeFromArray(
  unsigned int i,
  ON_SubDEdgePtr& removed_edge
  )
{
  removed_edge = ON_SubDEdgePtr::Null;
  unsigned int count = m_edge_count;
  if ( i >= count )
    return ON_SUBD_RETURN_ERROR(false);
  if (i < 4)
  {
    removed_edge = m_edge4[i];
  }
  if (count > 4)
  {
    if ( nullptr == m_edgex || m_edgex_capacity + ((unsigned short)4) < m_edge_count )
      return ON_SUBD_RETURN_ERROR(false);
    if ( i >= 4 )
      removed_edge = m_edgex[i-4];
  }

  unsigned int j = i+1;

  while (j < count)
  {
    const ON_SubDEdgePtr& edge_j = j < 4 ? m_edge4[j] : m_edgex[j - 4];
    if (i < 4)
      m_edge4[i] = edge_j;
    else
      m_edgex[i - 4] = edge_j;
    i++;
    j++;
  }

  m_edge_count--;

  return true;
}